

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.h
# Opt level: O2

void __thiscall
QVersionNumber::SegmentStorage::setSegments(SegmentStorage *this,int len,int maj,int min,int mic)

{
  long in_FS_OFFSET;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((mic + 0x80U | min + 0x80U | maj + 0x80U) < 0x100) {
    local_14 = maj;
    local_10 = min;
    local_c = mic;
    setInlineData(this,&local_14,(long)len);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    ::QVersionNumber::SegmentStorage::setVector((int)this,len,maj,min);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setSegments(int len, int maj, int min = 0, int mic = 0)
        {
            if (maj == qint8(maj) && min == qint8(min) && mic == qint8(mic)) {
                int data[] = { maj, min, mic };
                setInlineData(data, len);
            } else {
                setVector(len, maj, min, mic);
            }
        }